

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<13>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  CodedOutputStream *in_RSI;
  void *in_RDI;
  
  Get<unsigned_int>(in_RDI);
  io::CodedOutputStream::WriteVarint32(in_RSI,(uint32)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt32NoTag(Get<uint32>(ptr), output);
  }